

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O1

opj_image_t * j2k_decode_jpt_stream(opj_j2k_t *j2k,opj_cio_t *cio,opj_codestream_info_t *cstr_info)

{
  opj_common_ptr cinfo;
  opj_dec_mstabent_t *poVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  opj_dec_mstabent_t *e;
  opj_image_t *image;
  opj_dec_mstabent_t *poVar5;
  char *fmt;
  opj_image_t *poVar6;
  opj_jpt_msg_header_t header;
  opj_jpt_msg_header_t local_4c;
  
  cinfo = j2k->cinfo;
  j2k->cio = cio;
  image = opj_image_create0();
  j2k->image = image;
  j2k->state = 1;
  jpt_init_msg_header(&local_4c);
  jpt_read_msg_header(cinfo,cio,&local_4c);
  iVar2 = cio_tell(cio);
  poVar6 = image;
  if (local_4c.Class_Id == 6) {
    do {
      iVar3 = cio_numbytesleft(cio);
      if (iVar3 == 0) {
        j2k_read_eoc(j2k);
        iVar3 = 1;
        poVar6 = image;
      }
      else {
        iVar3 = cio_tell(cio);
        if (iVar3 - iVar2 == local_4c.Msg_length) {
          jpt_read_msg_header(cinfo,cio,&local_4c);
          iVar2 = cio_tell(cio);
          if (local_4c.Class_Id == 4) goto LAB_0012510d;
          opj_image_destroy(image);
          opj_event_msg(cinfo,1,"[JPT-stream] : Expecting Tile info !\n");
        }
        else {
LAB_0012510d:
          uVar4 = cio_read(cio,2);
          if ((uVar4 & 0xffffff00) == 0xff00) {
            poVar1 = j2k_dec_mstab;
            do {
              poVar5 = poVar1;
              if (poVar5->id == 0) break;
              poVar1 = poVar5 + 1;
            } while (poVar5->id != uVar4);
            if ((j2k->state & poVar5->states) != 0) {
              if (poVar5->handler != (_func_void_opj_j2k_t_ptr *)0x0) {
                (*poVar5->handler)(j2k);
              }
              iVar3 = 2;
              if ((j2k->state != 0x20) && (j2k->state != 0x40)) {
                iVar3 = 0;
              }
              goto LAB_00125224;
            }
            opj_image_destroy(image);
            iVar3 = cio_tell(cio);
            fmt = "%.8x: unexpected marker %x\n";
          }
          else {
            opj_image_destroy(image);
            iVar3 = cio_tell(cio);
            fmt = "%.8x: expected a marker instead of %x\n";
          }
          opj_event_msg(cinfo,1,fmt,(ulong)(iVar3 - 2),(ulong)uVar4);
        }
        iVar3 = 1;
        poVar6 = (opj_image_t *)0x0;
      }
LAB_00125224:
    } while (iVar3 == 0);
    if (iVar3 == 2) {
      if (j2k->state == 0x40) {
        j2k_read_eoc(j2k);
      }
      poVar6 = image;
      if (j2k->state != 0x20) {
        opj_event_msg(cinfo,2,"Incomplete bitstream\n");
      }
    }
  }
  else {
    opj_image_destroy(image);
    poVar6 = (opj_image_t *)0x0;
    opj_event_msg(cinfo,1,"[JPT-stream] : Expecting Main header first [class_Id %d] !\n",
                  (ulong)local_4c.Class_Id);
  }
  return poVar6;
}

Assistant:

opj_image_t* j2k_decode_jpt_stream(opj_j2k_t *j2k, opj_cio_t *cio,  opj_codestream_info_t *cstr_info) {
	opj_image_t *image = NULL;
	opj_jpt_msg_header_t header;
	int position;
	opj_common_ptr cinfo = j2k->cinfo;

	OPJ_ARG_NOT_USED(cstr_info);

	j2k->cio = cio;

	/* create an empty image */
	image = opj_image_create0();
	j2k->image = image;

	j2k->state = J2K_STATE_MHSOC;
	
	/* Initialize the header */
	jpt_init_msg_header(&header);
	/* Read the first header of the message */
	jpt_read_msg_header(cinfo, cio, &header);
	
	position = cio_tell(cio);
	if (header.Class_Id != 6) {	/* 6 : Main header data-bin message */
		opj_image_destroy(image);
		opj_event_msg(cinfo, EVT_ERROR, "[JPT-stream] : Expecting Main header first [class_Id %d] !\n", header.Class_Id);
		return 0;
	}
	
	for (;;) {
		opj_dec_mstabent_t *e = NULL;
		int id;
		
		if (!cio_numbytesleft(cio)) {
			j2k_read_eoc(j2k);
			return image;
		}
		/* data-bin read -> need to read a new header */
		if ((unsigned int) (cio_tell(cio) - position) == header.Msg_length) {
			jpt_read_msg_header(cinfo, cio, &header);
			position = cio_tell(cio);
			if (header.Class_Id != 4) {	/* 4 : Tile data-bin message */
				opj_image_destroy(image);
				opj_event_msg(cinfo, EVT_ERROR, "[JPT-stream] : Expecting Tile info !\n");
				return 0;
			}
		}
		
		id = cio_read(cio, 2);
		if (id >> 8 != 0xff) {
			opj_image_destroy(image);
			opj_event_msg(cinfo, EVT_ERROR, "%.8x: expected a marker instead of %x\n", cio_tell(cio) - 2, id);
			return 0;
		}
		e = j2k_dec_mstab_lookup(id);
		if (!(j2k->state & e->states)) {
			opj_image_destroy(image);
			opj_event_msg(cinfo, EVT_ERROR, "%.8x: unexpected marker %x\n", cio_tell(cio) - 2, id);
			return 0;
		}
		if (e->handler) {
			(*e->handler)(j2k);
		}
		if (j2k->state == J2K_STATE_MT) {
			break;
		}
		if (j2k->state == J2K_STATE_NEOC) {
			break;
		}
	}
	if (j2k->state == J2K_STATE_NEOC) {
		j2k_read_eoc(j2k);
	}
	
	if (j2k->state != J2K_STATE_MT) {
		opj_event_msg(cinfo, EVT_WARNING, "Incomplete bitstream\n");
	}

	return image;
}